

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PlotFileUtil.cpp
# Opt level: O2

void amrex::WriteGenericPlotfileHeader
               (ostream *HeaderFile,int nlevels,
               Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *bArray,
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *varnames,Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *geom,Real time,
               Vector<int,_std::allocator<int>_> *level_steps,
               Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *ref_ratio,
               string *versionName,string *levelPrefix,string *mfPrefix)

{
  undefined8 uVar1;
  int iVar2;
  pointer pbVar3;
  pointer pGVar4;
  pointer pBVar5;
  long *plVar6;
  pointer pGVar7;
  ostream *poVar8;
  ulong uVar9;
  uint uVar10;
  int ivar;
  long lVar11;
  int k;
  int i;
  long lVar12;
  ulong uVar13;
  int i_3;
  int iVar14;
  int iVar15;
  Box result;
  RealBox loc;
  
  *(undefined8 *)(HeaderFile + *(long *)(*(long *)HeaderFile + -0x18) + 8) = 0x11;
  poVar8 = std::operator<<(HeaderFile,(string *)versionName);
  std::operator<<(poVar8,'\n');
  poVar8 = std::ostream::_M_insert<long>((long)HeaderFile);
  std::operator<<(poVar8,'\n');
  lVar12 = 0;
  for (lVar11 = 0;
      pbVar3 = (varnames->
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar11 < (long)(varnames->
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5;
      lVar11 = lVar11 + 1) {
    poVar8 = std::operator<<(HeaderFile,(string *)((long)&(pbVar3->_M_dataplus)._M_p + lVar12));
    std::operator<<(poVar8,"\n");
    lVar12 = lVar12 + 0x20;
  }
  uVar10 = nlevels - 1;
  poVar8 = (ostream *)std::ostream::operator<<(HeaderFile,3);
  std::operator<<(poVar8,'\n');
  poVar8 = std::ostream::_M_insert<double>(time);
  std::operator<<(poVar8,'\n');
  poVar8 = (ostream *)std::ostream::operator<<(HeaderFile,uVar10);
  std::operator<<(poVar8,'\n');
  for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
    poVar8 = std::ostream::_M_insert<double>
                       (*(double *)
                         ((long)(((geom->
                                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->prob_domain).xlo +
                         lVar11 * 8));
    std::operator<<(poVar8,' ');
  }
  std::operator<<(HeaderFile,'\n');
  for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
    poVar8 = std::ostream::_M_insert<double>
                       (*(double *)
                         ((long)(((geom->
                                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->prob_domain).xhi +
                         lVar11 * 8));
    std::operator<<(poVar8,' ');
  }
  std::operator<<(HeaderFile,'\n');
  uVar13 = 0;
  uVar9 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    uVar9 = uVar13;
  }
  for (; uVar9 * 0xc - uVar13 != 0; uVar13 = uVar13 + 0xc) {
    poVar8 = (ostream *)
             std::ostream::operator<<
                       (HeaderFile,
                        *(int *)((long)((ref_ratio->
                                        super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                        ).
                                        super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->vect + uVar13));
    std::operator<<(poVar8,' ');
  }
  std::operator<<(HeaderFile,'\n');
  uVar13 = 0;
  uVar9 = (ulong)(uint)nlevels;
  if (nlevels < 1) {
    uVar9 = uVar13;
  }
  for (; uVar9 * 200 - uVar13 != 0; uVar13 = uVar13 + 200) {
    poVar8 = operator<<(HeaderFile,
                        (Box *)((long)&(((geom->
                                         super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                         ).
                                         super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->domain).
                                       smallend + uVar13));
    std::operator<<(poVar8,' ');
  }
  std::operator<<(HeaderFile,'\n');
  for (uVar13 = 0; uVar9 != uVar13; uVar13 = uVar13 + 1) {
    poVar8 = (ostream *)
             std::ostream::operator<<
                       (HeaderFile,
                        (level_steps->super_vector<int,_std::allocator<int>_>).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar13]);
    std::operator<<(poVar8,' ');
  }
  std::operator<<(HeaderFile,'\n');
  lVar11 = 0x20;
  for (uVar13 = 0; uVar13 != uVar9; uVar13 = uVar13 + 1) {
    for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
      poVar8 = std::ostream::_M_insert<double>
                         (*(double *)
                           ((long)(((geom->
                                    super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>)
                                    .
                                    super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->super_CoordSys).
                                  offset + lVar12 * 8 + lVar11 + 0xfffffffffffffff8U));
      std::operator<<(poVar8,' ');
    }
    std::operator<<(HeaderFile,'\n');
    lVar11 = lVar11 + 200;
  }
  poVar8 = (ostream *)
           std::ostream::operator<<
                     (HeaderFile,
                      (((geom->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                        super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                        _M_impl.super__Vector_impl_data._M_start)->super_CoordSys).c_sys);
  std::operator<<(poVar8,'\n');
  std::operator<<(HeaderFile,"0\n");
  for (uVar13 = 0; uVar13 != uVar9; uVar13 = uVar13 + 1) {
    poVar8 = (ostream *)std::ostream::operator<<(HeaderFile,(int)uVar13);
    poVar8 = std::operator<<(poVar8,' ');
    poVar8 = std::ostream::_M_insert<long>((long)poVar8);
    std::operator<<(poVar8,' ');
    poVar8 = std::ostream::_M_insert<double>(time);
    std::operator<<(poVar8,'\n');
    poVar8 = (ostream *)
             std::ostream::operator<<
                       (HeaderFile,
                        (level_steps->super_vector<int,_std::allocator<int>_>).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar13]);
    std::operator<<(poVar8,'\n');
    pGVar4 = (geom->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
             super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar11 = 0;
    while( true ) {
      pBVar5 = (bArray->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
               super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
               super__Vector_impl_data._M_start;
      plVar6 = *(long **)&pBVar5[uVar13].m_ref.
                          super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>;
      if ((plVar6[1] - *plVar6) / 0x1c <= lVar11) break;
      BoxArray::operator[]((Box *)&loc,pBVar5 + uVar13,(int)lVar11);
      iVar2 = pGVar4[uVar13].domain.smallend.vect[0];
      uVar1 = *(undefined8 *)((long)&pGVar4[uVar13].domain.smallend + 4);
      result.bigend.vect[2] = loc.xlo[2]._4_4_;
      result.btype.itype = loc.xhi[0]._0_4_;
      result.smallend.vect[0] = SUB84(loc.xlo[0],0);
      result.smallend.vect[1] = (int)((ulong)loc.xlo[0] >> 0x20);
      iVar15 = (int)((ulong)uVar1 >> 0x20);
      iVar14 = (int)uVar1;
      result.smallend.vect[2] = loc.xlo[1]._0_4_ - iVar15;
      result.bigend.vect[0] = loc.xlo[1]._4_4_ - iVar2;
      result.smallend.vect[1] = result.smallend.vect[1] - iVar14;
      result.smallend.vect[0] = result.smallend.vect[0] - iVar2;
      result.bigend.vect[1] = loc.xlo[2]._0_4_ - iVar14;
      result.bigend.vect[2] = result.bigend.vect[2] - iVar15;
      pGVar7 = (geom->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_start;
      RealBox::RealBox(&loc,&result,pGVar7[uVar13].super_CoordSys.dx,pGVar7[uVar13].prob_domain.xlo)
      ;
      for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
        poVar8 = std::ostream::_M_insert<double>(loc.xlo[lVar12]);
        std::operator<<(poVar8,' ');
        poVar8 = std::ostream::_M_insert<double>(loc.xhi[lVar12]);
        std::operator<<(poVar8,'\n');
      }
      lVar11 = lVar11 + 1;
    }
    MultiFabHeaderPath((string *)&loc,(int)uVar13,levelPrefix,mfPrefix);
    poVar8 = std::operator<<(HeaderFile,(string *)&loc);
    std::operator<<(poVar8,'\n');
    std::__cxx11::string::~string((string *)&loc);
  }
  return;
}

Assistant:

void
WriteGenericPlotfileHeader (std::ostream &HeaderFile,
                            int nlevels,
                            const Vector<BoxArray> &bArray,
                            const Vector<std::string> &varnames,
                            const Vector<Geometry> &geom,
                            Real time,
                            const Vector<int> &level_steps,
                            const Vector<IntVect> &ref_ratio,
                            const std::string &versionName,
                            const std::string &levelPrefix,
                            const std::string &mfPrefix)
{
//        BL_PROFILE("WriteGenericPlotfileHeader()");

        BL_ASSERT(nlevels <= bArray.size());
        BL_ASSERT(nlevels <= geom.size());
        BL_ASSERT(nlevels <= ref_ratio.size()+1);
        BL_ASSERT(nlevels <= level_steps.size());

        int finest_level(nlevels - 1);

        HeaderFile.precision(17);

        // ---- this is the generic plot file type name
        HeaderFile << versionName << '\n';

        HeaderFile << varnames.size() << '\n';

        for (int ivar = 0; ivar < varnames.size(); ++ivar) {
            HeaderFile << varnames[ivar] << "\n";
        }
        HeaderFile << AMREX_SPACEDIM << '\n';
        HeaderFile << time << '\n';
        HeaderFile << finest_level << '\n';
        for (int i = 0; i < AMREX_SPACEDIM; ++i) {
            HeaderFile << geom[0].ProbLo(i) << ' ';
        }
        HeaderFile << '\n';
        for (int i = 0; i < AMREX_SPACEDIM; ++i) {
            HeaderFile << geom[0].ProbHi(i) << ' ';
        }
        HeaderFile << '\n';
        for (int i = 0; i < finest_level; ++i) {
            HeaderFile << ref_ratio[i][0] << ' ';
        }
        HeaderFile << '\n';
        for (int i = 0; i <= finest_level; ++i) {
            HeaderFile << geom[i].Domain() << ' ';
        }
        HeaderFile << '\n';
        for (int i = 0; i <= finest_level; ++i) {
            HeaderFile << level_steps[i] << ' ';
        }
        HeaderFile << '\n';
        for (int i = 0; i <= finest_level; ++i) {
            for (int k = 0; k < AMREX_SPACEDIM; ++k) {
                HeaderFile << geom[i].CellSize()[k] << ' ';
            }
            HeaderFile << '\n';
        }
        HeaderFile << (int) geom[0].Coord() << '\n';
        HeaderFile << "0\n";

        for (int level = 0; level <= finest_level; ++level) {
            HeaderFile << level << ' ' << bArray[level].size() << ' ' << time << '\n';
            HeaderFile << level_steps[level] << '\n';

            const IntVect& domain_lo = geom[level].Domain().smallEnd();
            for (int i = 0; i < bArray[level].size(); ++i)
            {
                // Need to shift because the RealBox ctor we call takes the
                // physical location of index (0,0,0).  This does not affect
                // the usual cases where the domain index starts with 0.
                const Box& b = amrex::shift(bArray[level][i], -domain_lo);
                RealBox loc = RealBox(b, geom[level].CellSize(), geom[level].ProbLo());
                for (int n = 0; n < AMREX_SPACEDIM; ++n) {
                    HeaderFile << loc.lo(n) << ' ' << loc.hi(n) << '\n';
                }
            }

            HeaderFile << MultiFabHeaderPath(level, levelPrefix, mfPrefix) << '\n';
        }
}